

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_set_format_zip(archive *_a)

{
  int iVar1;
  void *__ptr;
  void *pvVar2;
  char *fmt;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_zip");
  if (iVar1 != -0x1e) {
    if (*(code **)&_a[2].file_count != (code *)0x0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    __ptr = calloc(1,0x130);
    if (__ptr == (void *)0x0) {
      fmt = "Can\'t allocate zip data";
    }
    else {
      *(undefined4 *)((long)__ptr + 0xa0) = 0xffffffff;
      *(code **)((long)__ptr + 0x60) = real_crc32;
      *(undefined8 *)((long)__ptr + 0x120) = 0x10000;
      pvVar2 = malloc(0x10000);
      *(void **)((long)__ptr + 0x128) = pvVar2;
      if (pvVar2 != (void *)0x0) {
        *(void **)&_a[1].current_codepage = __ptr;
        _a[1].sconv = (archive_string_conv *)0x256680;
        _a[2].vtable = (archive_vtable_conflict *)archive_write_zip_options;
        _a[2].archive_format_name = (char *)archive_write_zip_header;
        *(code **)&_a[2].compression_code = archive_write_zip_data;
        *(code **)&_a[2].archive_format = archive_write_zip_finish_entry;
        _a[2].compression_name = (char *)archive_write_zip_close;
        *(code **)&_a[2].file_count = archive_write_zip_free;
        _a->archive_format = 0x50000;
        _a->archive_format_name = "ZIP";
        return 0;
      }
      free(__ptr);
      fmt = "Can\'t allocate compression buffer";
    }
    archive_set_error(_a,0xc,fmt);
  }
  return -0x1e;
}

Assistant:

int
archive_write_set_format_zip(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct zip *zip;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_zip");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	zip = (struct zip *) calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip data");
		return (ARCHIVE_FATAL);
	}

	/* "Unspecified" lets us choose the appropriate compression. */
	zip->requested_compression = COMPRESSION_UNSPECIFIED;
	zip->crc32func = real_crc32;

#ifdef HAVE_ZLIB_H
	zip->len_buf = 65536;
	zip->buf = malloc(zip->len_buf);
	if (zip->buf == NULL) {
		free(zip);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate compression buffer");
		return (ARCHIVE_FATAL);
	}
#endif

	a->format_data = zip;
	a->format_name = "zip";
	a->format_options = archive_write_zip_options;
	a->format_write_header = archive_write_zip_header;
	a->format_write_data = archive_write_zip_data;
	a->format_finish_entry = archive_write_zip_finish_entry;
	a->format_close = archive_write_zip_close;
	a->format_free = archive_write_zip_free;
	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	a->archive.archive_format_name = "ZIP";

	return (ARCHIVE_OK);
}